

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O2

void __thiscall cmLinkItem::cmLinkItem(cmLinkItem *this)

{
  (this->String)._M_dataplus._M_p = (pointer)&(this->String).field_2;
  (this->String)._M_string_length = 0;
  (this->String).field_2._M_local_buf[0] = '\0';
  this->Target = (cmGeneratorTarget *)0x0;
  this->Cross = false;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  return;
}

Assistant:

cmLinkItem::cmLinkItem() = default;